

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

void __thiscall
cmCMakePresetsGraph::PrintPackagePresetList
          (cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_cmCMakePresetsGraph::PackagePreset_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx:1377:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_cmCMakePresetsGraph::PackagePreset_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx:1377:32)>
             ::_M_manager;
  PrintPackagePresetList
            (this,(function<bool_(const_cmCMakePresetsGraph::PackagePreset_&)> *)&local_28,newline);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintPackagePresetList(
  PrintPrecedingNewline* newline) const
{
  this->PrintPackagePresetList([](const PackagePreset&) { return true; },
                               newline);
}